

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackFrame.SystemV.cpp
# Opt level: O0

bool __thiscall Js::Amd64StackFrame::Next(Amd64StackFrame *this)

{
  void *pvVar1;
  Amd64StackFrame *this_local;
  
  pvVar1 = GetAddressOfReturnAddress(this,false,true);
  this->addressOfCodeAddr = pvVar1;
  pvVar1 = GetReturnAddress(this,false,true);
  this->codeAddr = pvVar1;
  this->frame = (void **)*this->frame;
  return this->frame != (void **)0x0;
}

Assistant:

bool
Amd64StackFrame::Next()
{
    this->addressOfCodeAddr = this->GetAddressOfReturnAddress();
    this->codeAddr = this->GetReturnAddress();
    this->frame = (void **)this->frame[0];
    return frame != nullptr;
}